

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::InteractionUniformBuffers1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionUniformBuffers1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  iterator iVar1;
  TestError *pTVar2;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = std::
          _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
          ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                  *)supported_variable_types_map,test_shader_compilation::var_types_set_gl);
  if (iVar1._M_node == (_Base_ptr)(supported_variable_types_map + 8)) {
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Type not found.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1aec);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)&shader_source);
  std::operator+(&local_70,"    ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &iVar1._M_node[1]._M_parent);
  std::operator+(&local_50,&local_70," x[1][1][1][1][1][1];\n");
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((string *)&shader_source);
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    break;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 4:
  case 3:
    std::__cxx11::string::append((string *)&shader_source);
    break;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1ae5);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_01722e5c + *(int *)(&DAT_01722e5c + (ulong)tested_shader_type * 4)))
            (&DAT_01722e5c + *(int *)(&DAT_01722e5c + (ulong)tested_shader_type * 4),
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_);
  return;
}

Assistant:

void InteractionUniformBuffers1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source;

			shader_source += "uniform uBlocka {\n";
			shader_source += "    " + var_iterator->second.type + " x[1][1][1][1][1][1];\n";
			shader_source += "};\n\n";
			shader_source += shader_start;

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}